

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

Reference<std::allocator<absl::cord_internal::CordRep_*>_> __thiscall
absl::inlined_vector_internal::
Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>::
EmplaceBackSlow<absl::cord_internal::CordRep*const&>
          (Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
           *this,CordRep **args)

{
  CordRep **ppCVar1;
  ulong uVar2;
  ulong uVar3;
  Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>> *pSVar4;
  size_type __n;
  CordRep **local_48;
  size_type sStack_40;
  CordRep **local_38;
  
  uVar2 = *(ulong *)this;
  pSVar4 = *(Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
             **)(this + 8);
  uVar3 = uVar2 >> 1;
  local_48 = (CordRep **)0x0;
  sStack_40 = 0;
  __n = 4;
  if ((uVar2 & 1) != 0) {
    __n = *(long *)(this + 0x10) * 2;
  }
  local_38 = args;
  local_48 = __gnu_cxx::new_allocator<absl::cord_internal::CordRep_*>::allocate
                       ((new_allocator<absl::cord_internal::CordRep_*> *)&local_48,__n,(void *)0x0);
  local_48[uVar3] = *local_38;
  if (1 < uVar2) {
    if ((uVar2 & 1) == 0) {
      pSVar4 = this + 8;
    }
    uVar2 = 0;
    do {
      local_48[uVar2] = *(CordRep **)(pSVar4 + uVar2 * 8);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  ppCVar1 = local_48 + uVar3;
  uVar2 = *(ulong *)this;
  sStack_40 = __n;
  if ((uVar2 & 1) != 0) {
    operator_delete(*(void **)(this + 8),*(long *)(this + 0x10) << 3);
    uVar2 = *(ulong *)this;
  }
  *(CordRep ***)(this + 8) = local_48;
  *(size_type *)(this + 0x10) = sStack_40;
  *(ulong *)this = (uVar2 | 1) + 2;
  return ppCVar1;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }